

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O2

Document * __thiscall svg::Document::operator<<(Document *this,Shape *shape)

{
  string local_30 [32];
  
  (*(shape->super_Serializeable)._vptr_Serializeable[2])(local_30,shape,&this->layout);
  std::__cxx11::string::append((string *)&this->body_nodes_str);
  std::__cxx11::string::~string(local_30);
  return this;
}

Assistant:

Document & operator<<(Shape const & shape)
        {
            body_nodes_str += shape.toString(layout);
            return *this;
        }